

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie_test.cpp
# Opt level: O3

void __thiscall unit_test::main(unit_test *this,string *param_1)

{
  cookie *pcVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
  *__x;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Self __tmp;
  cookies_type cookies;
  char local_1b1;
  char local_1b0;
  undefined7 uStack_1af;
  long local_1a8;
  undefined1 local_1a0 [16];
  char *local_190;
  long local_188;
  char local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
  local_f0 [4];
  
  pcVar1 = (cookie *)cppcms::application::response();
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"normal","");
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"token","");
  cppcms::http::cookie::cookie((cookie *)local_f0,local_110,local_130);
  cppcms::http::response::set_cookie(pcVar1);
  cppcms::http::cookie::~cookie((cookie *)local_f0);
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  if (local_110[0] != local_100) {
    operator_delete(local_110[0]);
  }
  pcVar1 = (cookie *)cppcms::application::response();
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"utf","");
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_170,anon_var_dwarf_4cef,anon_var_dwarf_4cef + 0x11);
  cppcms::http::cookie::cookie((cookie *)local_f0,local_150,local_170);
  cppcms::http::response::set_cookie(pcVar1);
  cppcms::http::cookie::~cookie((cookie *)local_f0);
  if (local_170[0] != local_160) {
    operator_delete(local_170[0]);
  }
  if (local_150[0] != local_140) {
    operator_delete(local_150[0]);
  }
  cppcms::application::request();
  __x = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
         *)cppcms::http::request::cookies_abi_cxx11_();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
  ::_Rb_tree(local_f0,__x);
  if ((_Rb_tree_header *)local_f0[0]._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_f0[0]._M_impl.super__Rb_tree_header) {
    p_Var3 = local_f0[0]._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      cppcms::application::response();
      poVar2 = (ostream *)cppcms::http::response::out();
      cppcms::http::cookie::name_abi_cxx11_();
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_190,local_188);
      local_1b0 = ':';
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1b0,1);
      cppcms::http::cookie::value_abi_cxx11_();
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)CONCAT71(uStack_1af,local_1b0),local_1a8);
      local_1b1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1b1,1);
      if ((undefined1 *)CONCAT71(uStack_1af,local_1b0) != local_1a0) {
        operator_delete((undefined1 *)CONCAT71(uStack_1af,local_1b0));
      }
      if (local_190 != local_180) {
        operator_delete(local_190);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != &local_f0[0]._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
  ::~_Rb_tree(local_f0);
  return;
}

Assistant:

virtual void main(std::string /*test*/)
	{
		response().set_cookie(cppcms::http::cookie("normal","token"));
		response().set_cookie(cppcms::http::cookie("utf","\xD7\xA9\xD7\x9C\xD7\x95\xD7\x9D \xD7\xA9\xD7\x9C\xD7\x95\xD7\x9D"));
		typedef cppcms::http::request::cookies_type cookies_type;
		cookies_type cookies=request().cookies();
		for(cookies_type::iterator cookie=cookies.begin();cookie!=cookies.end();cookie++) {
			response().out()<<cookie->second.name()<<':'<<cookie->second.value()<<'\n';
		}
	}